

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeSwitch::ParseNodeSwitch
          (ParseNodeSwitch *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeSwitch *this_local;
  
  ParseNodeStmt::ParseNodeStmt(&this->super_ParseNodeStmt,nop,ichMin,ichLim);
  return;
}

Assistant:

ParseNodeSwitch::ParseNodeSwitch(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeStmt(nop, ichMin, ichLim)
{
}